

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

String testing::internal::GetCurrentOsStackTraceExceptTop(UnitTest *param_1,int skip_count)

{
  _func_int **pp_Var1;
  size_t extraout_RDX;
  String SVar2;
  
  UnitTest::GetInstance();
  pp_Var1 = (_func_int **)operator_new__(1);
  *(undefined1 *)pp_Var1 = 0;
  param_1->_vptr_UnitTest = pp_Var1;
  (param_1->mutex_).super_MutexBase.mutex_.__align = 0;
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)param_1;
  return SVar2;
}

Assistant:

String GetCurrentOsStackTraceExceptTop(UnitTest* /*unit_test*/,
                                       int skip_count) {
  // We pass skip_count + 1 to skip this wrapper function in addition
  // to what the user really wants to skip.
  return GetUnitTestImpl()->CurrentOsStackTraceExceptTop(skip_count + 1);
}